

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qaction.cpp
# Opt level: O3

void __thiscall QAction::setWhatsThis(QAction *this,QString *whatsthis)

{
  QActionPrivate *this_00;
  long lVar1;
  char cVar2;
  QStringView QVar3;
  QStringView QVar4;
  
  this_00 = *(QActionPrivate **)&this->field_0x8;
  lVar1 = (this_00->whatsthis).d.size;
  if (lVar1 == (whatsthis->d).size) {
    QVar3.m_data = (this_00->whatsthis).d.ptr;
    QVar3.m_size = lVar1;
    QVar4.m_data = (whatsthis->d).ptr;
    QVar4.m_size = lVar1;
    cVar2 = QtPrivate::equalStrings(QVar3,QVar4);
    if (cVar2 != '\0') {
      return;
    }
  }
  QString::operator=(&this_00->whatsthis,(QString *)whatsthis);
  QActionPrivate::sendDataChanged(this_00);
  return;
}

Assistant:

void QAction::setWhatsThis(const QString &whatsthis)
{
    Q_D(QAction);
    if (d->whatsthis == whatsthis)
        return;

    d->whatsthis = whatsthis;
    d->sendDataChanged();
}